

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

void Cba_ManWriteVerilog(char *pFileName,Cba_Man_t *p,int fInlineConcat)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *__s;
  ulong uVar8;
  int i;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  
  pvVar4 = p->pMioLib;
  if ((pvVar4 != (void *)0x0) && (pvVar5 = Abc_FrameReadLibGen(), pvVar4 != pvVar5)) {
    puts("Genlib library used in the mapped design is not longer a current library.");
    return;
  }
  Cba_ManCreatePrimMap(p->pTypeNames);
  p->nOpens = 1;
  lVar9 = 0;
  (p->vOut).nSize = 0;
  (p->vOut2).nSize = 0;
  do {
    cVar1 = "// Design \""[lVar9];
    uVar2 = (p->vOut).nCap;
    if ((p->vOut).nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar2 * 2;
        if ((int)sVar11 <= (int)uVar2) goto LAB_00356a2a;
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar11);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar11);
        }
      }
      (p->vOut).pArray = pcVar6;
      (p->vOut).nCap = (int)sVar11;
    }
LAB_00356a2a:
    iVar3 = (p->vOut).nSize;
    (p->vOut).nSize = iVar3 + 1;
    (p->vOut).pArray[iVar3] = cVar1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xb);
  pcVar6 = p->pName;
  sVar11 = strlen(pcVar6);
  if (0 < (int)(uint)sVar11) {
    uVar8 = 0;
    do {
      cVar1 = pcVar6[uVar8];
      uVar2 = (p->vOut).nCap;
      if ((p->vOut).nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          pcVar7 = (p->vOut).pArray;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,0x10);
          }
          sVar10 = 0x10;
        }
        else {
          sVar10 = (ulong)uVar2 * 2;
          if ((int)sVar10 <= (int)uVar2) goto LAB_00356af4;
          pcVar7 = (p->vOut).pArray;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,sVar10);
          }
        }
        (p->vOut).pArray = pcVar7;
        (p->vOut).nCap = (int)sVar10;
      }
LAB_00356af4:
      iVar3 = (p->vOut).nSize;
      (p->vOut).nSize = iVar3 + 1;
      (p->vOut).pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar11 & 0x7fffffff) != uVar8);
  }
  lVar9 = 0;
  do {
    cVar1 = "\" written via CBA package in ABC on "[lVar9];
    uVar2 = (p->vOut).nCap;
    if ((p->vOut).nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar2 * 2;
        if ((int)sVar11 <= (int)uVar2) goto LAB_00356ba3;
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar11);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar11);
        }
      }
      (p->vOut).pArray = pcVar6;
      (p->vOut).nCap = (int)sVar11;
    }
LAB_00356ba3:
    iVar3 = (p->vOut).nSize;
    (p->vOut).nSize = iVar3 + 1;
    (p->vOut).pArray[iVar3] = cVar1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x24);
  pcVar6 = Extra_TimeStamp();
  sVar11 = strlen(pcVar6);
  if (0 < (int)(uint)sVar11) {
    uVar8 = 0;
    do {
      cVar1 = pcVar6[uVar8];
      uVar2 = (p->vOut).nCap;
      if ((p->vOut).nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          pcVar7 = (p->vOut).pArray;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,0x10);
          }
          sVar10 = 0x10;
        }
        else {
          sVar10 = (ulong)uVar2 * 2;
          if ((int)sVar10 <= (int)uVar2) goto LAB_00356c70;
          pcVar7 = (p->vOut).pArray;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar10);
          }
          else {
            pcVar7 = (char *)realloc(pcVar7,sVar10);
          }
        }
        (p->vOut).pArray = pcVar7;
        (p->vOut).nCap = (int)sVar10;
      }
LAB_00356c70:
      iVar3 = (p->vOut).nSize;
      (p->vOut).nSize = iVar3 + 1;
      (p->vOut).pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar11 & 0x7fffffff) != uVar8);
  }
  lVar9 = 0;
  do {
    cVar1 = ".end\n\n\n"[lVar9 + 5];
    uVar2 = (p->vOut).nCap;
    if ((p->vOut).nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar2 * 2;
        if ((int)sVar11 <= (int)uVar2) goto LAB_00356d1f;
        pcVar6 = (p->vOut).pArray;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar11);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar11);
        }
      }
      (p->vOut).pArray = pcVar6;
      (p->vOut).nCap = (int)sVar11;
    }
LAB_00356d1f:
    iVar3 = (p->vOut).nSize;
    (p->vOut).nSize = iVar3 + 1;
    (p->vOut).pArray[iVar3] = cVar1;
    lVar9 = lVar9 + 1;
    if (lVar9 == 2) {
      if (1 < (p->vNtks).nSize) {
        lVar9 = 1;
        do {
          Cba_ManWriteVerilogNtk((Cba_Ntk_t *)(p->vNtks).pArray[lVar9],fInlineConcat);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (p->vNtks).nSize);
      }
      if ((p->vOut).nSize < 1) {
        return;
      }
      __s = fopen(pFileName,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\" for writing.\n",pFileName);
        return;
      }
      fwrite((p->vOut).pArray,1,(long)(p->vOut).nSize,__s);
      fclose(__s);
      return;
    }
  } while( true );
}

Assistant:

void Cba_ManWriteVerilog( char * pFileName, Cba_Man_t * p, int fInlineConcat )
{
    Cba_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    Cba_ManCreatePrimMap( p->pTypeNames );
    // derive the stream
    p->nOpens = 1;
    Vec_StrClear( &p->vOut );
    Vec_StrClear( &p->vOut2 );
    Vec_StrPrintStr( &p->vOut, "// Design \"" );
    Vec_StrPrintStr( &p->vOut, Cba_ManName(p) );
    Vec_StrPrintStr( &p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( &p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( &p->vOut, "\n\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_ManWriteVerilogNtk( pNtk, fInlineConcat );
    // dump into file
    if ( Vec_StrSize(&p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(&p->vOut), 1, Vec_StrSize(&p->vOut), pFile );
            fclose( pFile );
        }
    }
}